

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall
tinyusdz::Stage::find_prim_from_relative_path
          (Stage *this,Prim *root,Path *relative_path,Prim **prim,string *err)

{
  value_type *ppPVar1;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  GetPrimFromRelativePath_abi_cxx11_(&local_40,(Stage *)root,(Prim *)relative_path,relative_path);
  if (local_40.contained.
      super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    ppPVar1 = nonstd::expected_lite::
              expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value(&local_40);
    *prim = *ppPVar1;
  }
  else if (err != (string *)0x0) {
    nonstd::expected_lite::
    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::error(&local_40);
    ::std::__cxx11::string::_M_assign((string *)err);
  }
  nonstd::expected_lite::
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&local_40);
  return local_40.contained.
         super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_has_value;
}

Assistant:

bool Stage::find_prim_from_relative_path(const Prim &root,
                                         const Path &relative_path,
                                         const Prim *&prim,
                                         std::string *err) const {
  nonstd::expected<const Prim *, std::string> ret =
      GetPrimFromRelativePath(root, relative_path);
  if (ret) {
    prim = ret.value();
    return true;
  } else {
    if (err) {
      (*err) = ret.error();
    }
    return false;
  }
}